

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

void __thiscall
entityx::EventManager::
emit<entityx::ComponentAddedEvent<Position>,entityx::Entity,entityx::ComponentHandle<Position,entityx::EntityManager>&>
          (EventManager *this,Entity *args,ComponentHandle<Position,_entityx::EntityManager> *args_1
          )

{
  ComponentHandle<Position,_entityx::EntityManager> component;
  Entity entity;
  EventSignalPtr *this_00;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  EntityManager *in_RDI;
  EventSignalPtr sig;
  ComponentAddedEvent<Position> event;
  ComponentAddedEvent<Position> *in_stack_ffffffffffffff60;
  Id in_stack_ffffffffffffff70;
  EntityManager *in_stack_ffffffffffffff78;
  Id in_stack_ffffffffffffff80;
  shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_> local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  
  local_58 = *in_RSI;
  uStack_50 = in_RSI[1];
  local_68 = *in_RDX;
  uStack_60 = in_RDX[1];
  entity.id_.id_ = in_stack_ffffffffffffff80.id_;
  entity.manager_ = in_stack_ffffffffffffff78;
  component.id_.id_ = in_stack_ffffffffffffff70.id_;
  component.manager_ = in_RDI;
  ComponentAddedEvent<Position>::ComponentAddedEvent(in_stack_ffffffffffffff60,entity,component);
  Event<entityx::ComponentAddedEvent<Position>_>::family();
  this_00 = signal_for((EventManager *)in_stack_ffffffffffffff80.id_,
                       (size_t)in_stack_ffffffffffffff78);
  Catch::clara::std::
  shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>::shared_ptr
            (this_00,&local_78);
  Catch::clara::std::
  __shared_ptr_access<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2eab38);
  Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::emit
            ((ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *)
             in_stack_ffffffffffffff80.id_,in_stack_ffffffffffffff78);
  Catch::clara::std::
  shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>::
  ~shared_ptr((shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
               *)0x2eab51);
  ComponentAddedEvent<Position>::~ComponentAddedEvent((ComponentAddedEvent<Position> *)0x2eab5b);
  return;
}

Assistant:

void emit(Args && ... args) {
    // Using 'E event(std::forward...)' causes VS to fail with an internal error. Hack around it.
    E event = E(std::forward<Args>(args) ...);
    auto sig = signal_for(std::size_t(Event<E>::family()));
    sig->emit(&event);
  }